

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlendState.h
# Opt level: O0

void __thiscall Diligent::RenderTargetBlendDesc::RenderTargetBlendDesc(RenderTargetBlendDesc *this)

{
  RenderTargetBlendDesc *this_local;
  
  this->BlendEnable = false;
  this->LogicOperationEnable = false;
  this->SrcBlend = BLEND_FACTOR_ONE;
  this->DestBlend = BLEND_FACTOR_ZERO;
  this->BlendOp = BLEND_OPERATION_ADD;
  this->SrcBlendAlpha = BLEND_FACTOR_ONE;
  this->DestBlendAlpha = BLEND_FACTOR_ZERO;
  this->BlendOpAlpha = BLEND_OPERATION_ADD;
  this->LogicOp = LOGIC_OP_NOOP;
  this->RenderTargetWriteMask = COLOR_MASK_ALL;
  return;
}

Assistant:

constexpr RenderTargetBlendDesc() noexcept {}